

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# html.cpp
# Opt level: O2

AttrMap * __thiscall
crawler::Parser::parseAttributes_abi_cxx11_(AttrMap *__return_storage_ptr__,Parser *this)

{
  _Rb_tree_header *p_Var1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  attribute;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  pStack_58;
  
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  while( true ) {
    consumeWhitespace(this);
    if ((this->input)._M_dataplus._M_p[this->pos] == '>') break;
    parseAttribute_abi_cxx11_(&pStack_58,this);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)__return_storage_ptr__,&pStack_58);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&pStack_58);
  }
  return __return_storage_ptr__;
}

Assistant:

crawler::AttrMap crawler::Parser::parseAttributes() {
  std::map<std::string, std::string> attributes;
  while (true) {
    consumeWhitespace();
    if (nextChar() == '>') {
      break;
    }
    std::pair<std::string, std::string> attribute = parseAttribute();
    attributes.insert(attribute);
  }
  return attributes;
}